

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupDemiterOrderXors2(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  int iObj;
  int local_2c;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  if (0 < vXors->nSize) {
    lVar4 = 0;
    do {
      local_2c = vXors->pArray[lVar4];
      iVar1 = Gia_ManSuppSize(p,&local_2c,1);
      Vec_IntPush(p_00,iVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vXors->nSize);
  }
  piVar2 = Abc_MergeSortCost(p_00->pArray,p_00->nSize);
  p_00->nSize = 0;
  uVar3 = (ulong)(uint)vXors->nSize;
  if (0 < vXors->nSize) {
    lVar4 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if (((long)iVar1 < 0) || ((int)uVar3 <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,vXors->pArray[iVar1]);
      lVar4 = lVar4 + 1;
      uVar3 = (ulong)vXors->nSize;
    } while (lVar4 < (long)uVar3);
  }
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  vXors->nSize = 0;
  iVar1 = p_00->nSize;
  if (0 < (long)iVar1) {
    piVar2 = p_00->pArray;
    lVar4 = 0;
    do {
      Vec_IntPush(vXors,piVar2[lVar4]);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManDupDemiterOrderXors2( Gia_Man_t * p, Vec_Int_t * vXors )
{
    int i, iObj, * pPerm;
    Vec_Int_t * vSizes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vXors, iObj, i )
        Vec_IntPush( vSizes, Gia_ManSuppSize(p, &iObj, 1) );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vSizes), Vec_IntSize(vSizes) );
    Vec_IntClear( vSizes );
    for ( i = 0; i < Vec_IntSize(vXors); i++ )
        Vec_IntPush( vSizes, Vec_IntEntry(vXors, pPerm[i]) );
    ABC_FREE( pPerm );
    Vec_IntClear( vXors );
    Vec_IntAppend( vXors, vSizes );
    Vec_IntFree( vSizes );
}